

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O0

void __thiscall
nuraft::stat_mgr::get_all_stats
          (stat_mgr *this,
          vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_> *stats_out)

{
  size_type __n;
  bool bVar1;
  reference ppVar2;
  reference ppsVar3;
  vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_> *in_RSI;
  long in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>
  *entry;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  *__range1;
  size_t idx;
  unique_lock<std::mutex> l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  *in_stack_ffffffffffffff88;
  stat_elem *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb0;
  _Self local_48;
  long local_40;
  size_type local_38;
  vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_> *local_10;
  
  local_10 = in_RSI;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)in_stack_ffffffffffffff88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
          *)0x2330fa);
  std::vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_>::resize
            ((vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_> *)
             in_stack_ffffffffffffffb0._M_node,in_stack_ffffffffffffffa8);
  local_38 = 0;
  local_40 = in_RDI + 0x28;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
       ::begin(in_stack_ffffffffffffff88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  ::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(&local_48,(_Self *)&stack0xffffffffffffffb0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
                          *)0x23315d);
    __n = local_38;
    in_stack_ffffffffffffff90 = ppVar2->second;
    local_38 = local_38 + 1;
    ppsVar3 = std::vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_>::operator[]
                        (local_10,__n);
    *ppsVar3 = in_stack_ffffffffffffff90;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>
                  *)in_stack_ffffffffffffff90);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void stat_mgr::get_all_stats(std::vector<stat_elem*>& stats_out) {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    stats_out.resize(stat_map_.size());
    size_t idx = 0;
    for (auto& entry: stat_map_) {
        stats_out[idx++] = entry.second;
    }
}